

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall
wasm::PassRunner::doAdd
          (PassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar2 = (*((pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[7])();
  if ((char)iVar2 != '\0') {
    bVar1 = shouldPreserveDWARF(this);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"warning: running pass \'");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &((pass->_M_t).
                                        super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                        .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->
                                       name);
      std::operator<<(poVar3,"\' which is not fully compatible with DWARF\n");
    }
  }
  bVar1 = passRemovesDebugInfo
                    (&((pass->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
  if (bVar1) {
    this->addedPassesRemovedDWARF = true;
  }
  std::
  vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
  ::emplace_back<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>
            ((vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
              *)&this->passes,pass);
  return;
}

Assistant:

void PassRunner::doAdd(std::unique_ptr<Pass> pass) {
  if (pass->invalidatesDWARF() && shouldPreserveDWARF()) {
    std::cerr << "warning: running pass '" << pass->name
              << "' which is not fully compatible with DWARF\n";
  }
  if (passRemovesDebugInfo(pass->name)) {
    addedPassesRemovedDWARF = true;
  }
  passes.emplace_back(std::move(pass));
}